

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O3

void __thiscall brown::Simulator::Simulator(Simulator *this)

{
  ulong uVar1;
  int64_t *piVar2;
  int *piVar3;
  char *pcVar4;
  ulong uVar5;
  
  this->_vptr_Simulator = (_func_int **)&PTR___cxa_pure_virtual_0010ad58;
  this->BMPXRES = 800;
  this->BMPYRES = 800;
  this->CLKFRQ = 100000000;
  this->PULPERPIX = 0x40;
  this->MAXACC = 640000;
  this->MAXVEL = 10000;
  this->MINVEL = 1000;
  this->MINPOS = -0x6400;
  this->MAXPOS = 0x6400;
  this->MAXT = 100000;
  this->MINT = 10000;
  this->FIFMAX = 0x1000000;
  Tile::Tile(&this->drawing,800,800,0);
  *(undefined4 *)&this->pclk = 0xffffffff;
  *(undefined4 *)((long)&this->pclk + 4) = 0xffffffff;
  *(undefined4 *)this->oclk = 0xffffffff;
  *(undefined4 *)((long)this->oclk + 4) = 0xffffffff;
  this->oclk[1] = -1;
  this->ooclk[0] = -2;
  this->ooclk[1] = -2;
  this->odir[0] = 0;
  this->odir[1] = 0;
  *(undefined4 *)((long)this->odir + 7) = 0;
  this->cur[0] = 0;
  this->cur[1] = 0;
  this->acur[0] = 0;
  this->acur[1] = 0;
  *(undefined1 (*) [16])(this->acur + 1) = (undefined1  [16])0x0;
  this->fifn = 0;
  this->pulcount[0] = 0;
  *(undefined1 (*) [16])(this->pulcount + 1) = (undefined1  [16])0x0;
  this->zoom = 1000000;
  uVar1 = this->FIFMAX;
  piVar2 = (int64_t *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
  this->fifclk = piVar2;
  uVar5 = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  piVar3 = (int *)operator_new__(uVar5);
  this->fifcurx = piVar3;
  piVar3 = (int *)operator_new__(uVar5);
  this->fifcury = piVar3;
  pcVar4 = (char *)operator_new__(uVar1);
  this->fifbit = pcVar4;
  return;
}

Assistant:

Simulator::Simulator():
    BMPXRES(BMPXRES_), BMPYRES(BMPYRES_),
    CLKFRQ(CLKFRQ_), PULPERPIX(PULPERPIX_), MAXACC(MAXACC_),
    MAXVEL(MAXVEL_), MINVEL(MINVEL_),
    MINPOS(MINPOS_), MAXPOS(MAXPOS_),
    MAXT(CLKFRQ_/MINVEL_), MINT(CLKFRQ_/MAXVEL_),
    FIFMAX(FIFMAX_),
    drawing(BMPXRES_, BMPYRES_, BACKGROUND_COLOR) {
    fifclk = new std::int64_t[FIFMAX];
    fifcurx = new int[FIFMAX];
    fifcury = new int[FIFMAX];
    fifbit = new char[FIFMAX];
}